

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_0::TextureCubeLodControlTestInstance::~TextureCubeLodControlTestInstance
          (TextureCubeLodControlTestInstance *this)

{
  code *pcVar1;
  TextureCubeLodControlTestInstance *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TextureCubeLodControlTestInstance::~TextureCubeLodControlTestInstance (void)
{
}